

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vsubuqm_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  uVar1 = a->u64[0];
  uVar2 = b->u64[0];
  uVar3 = a->u64[1];
  uVar4 = b->u64[1];
  r->u64[0] = uVar1 - b->u64[0];
  r->u64[1] = (uVar3 - uVar4) - (ulong)(uVar1 < uVar2);
  return;
}

Assistant:

void helper_vsubuqm(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
#ifdef CONFIG_INT128
    r->u128 = a->u128 - b->u128;
#else
    ppc_avr_t tmp;
    ppc_avr_t one = QW_ONE;

    avr_qw_not(&tmp, *b);
    avr_qw_add(&tmp, *a, tmp);
    avr_qw_add(r, tmp, one);
#endif
}